

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O1

void __thiscall hdc::SourceFile::addImport(SourceFile *this,Import *import)

{
  pointer *pppIVar1;
  iterator __position;
  Import *local_10;
  
  __position._M_current =
       (this->imports).super__Vector_base<hdc::Import_*,_std::allocator<hdc::Import_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = import;
  if (__position._M_current ==
      (this->imports).super__Vector_base<hdc::Import_*,_std::allocator<hdc::Import_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<hdc::Import*,std::allocator<hdc::Import*>>::_M_realloc_insert<hdc::Import*const&>
              ((vector<hdc::Import*,std::allocator<hdc::Import*>> *)&this->imports,__position,
               &local_10);
  }
  else {
    *__position._M_current = import;
    pppIVar1 = &(this->imports).super__Vector_base<hdc::Import_*,_std::allocator<hdc::Import_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  ASTNode::setParentNode(&local_10->super_ASTNode,&this->super_ASTNode);
  return;
}

Assistant:

void SourceFile::addImport(Import* import) {
    imports.push_back(import);
    import->setParentNode(this);
}